

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRT_builder_main.cpp
# Opt level: O2

CProgram * parseCodeWithLex(string *testfile_name)

{
  CProgram *in_RAX;
  ostream *poVar1;
  CProgram *cProgram;
  
  line_number = 1;
  column_number = line_number;
  cProgram = in_RAX;
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<(poVar1,"Processing: ");
  poVar1 = std::operator<<(poVar1,(string *)testfile_name);
  std::endl<char,std::char_traits<char>>(poVar1);
  yyin = (FILE *)fopen((testfile_name->_M_dataplus)._M_p,"r");
  yyrestart(yyin);
  yyparse(&cProgram);
  fclose((FILE *)yyin);
  return cProgram;
}

Assistant:

CProgram *parseCodeWithLex( const std::string &testfile_name ) {
    CProgram *cProgram;
    line_number = 1;
    column_number = 1;
    std::cout << std::endl << "Processing: " << testfile_name << std::endl;
    yyin = fopen( testfile_name.c_str( ), "r" );
    yyrestart( yyin );
    yyparse( &cProgram );
    fclose( yyin );

    return cProgram;
}